

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneobject.cpp
# Opt level: O3

mat4 * __thiscall SceneObject::getLocalToWorld(SceneObject *this)

{
  undefined8 uVar1;
  mat4 *in_RDI;
  
  uVar1 = *(undefined8 *)((long)&(this->localToWorld).value[0].field_0 + 8);
  *(undefined8 *)&in_RDI->value[0].field_0 = *(undefined8 *)&(this->localToWorld).value[0].field_0;
  *(undefined8 *)((long)&in_RDI->value[0].field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(this->localToWorld).value[1].field_0 + 8);
  *(undefined8 *)&in_RDI->value[1].field_0 = *(undefined8 *)&(this->localToWorld).value[1].field_0;
  *(undefined8 *)((long)&in_RDI->value[1].field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(this->localToWorld).value[2].field_0 + 8);
  *(undefined8 *)&in_RDI->value[2].field_0 = *(undefined8 *)&(this->localToWorld).value[2].field_0;
  *(undefined8 *)((long)&in_RDI->value[2].field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(this->localToWorld).value[3].field_0 + 8);
  *(undefined8 *)&in_RDI->value[3].field_0 = *(undefined8 *)&(this->localToWorld).value[3].field_0;
  *(undefined8 *)((long)&in_RDI->value[3].field_0 + 8) = uVar1;
  return in_RDI;
}

Assistant:

glm::mat4 SceneObject::getLocalToWorld() const {
    return localToWorld;
}